

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_file.cpp
# Opt level: O0

int main(int nargs,char **args)

{
  bool bVar1;
  istream *piVar2;
  char *pcVar3;
  reference pbVar4;
  ostream *this;
  int local_764;
  istringstream local_760 [8];
  istringstream istr;
  string local_5e0 [8];
  string riga;
  double local_5c0;
  double t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578 [32];
  ostream local_558 [8];
  ofstream ofi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [32];
  istream local_2f8 [8];
  ifstream ifi;
  string local_f0 [8];
  string f;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string folderout;
  string local_98 [32];
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nomi;
  allocator local_49;
  string local_48 [8];
  string folderin;
  double local_28;
  double tf;
  double ti;
  char **args_local;
  int nargs_local;
  
  args_local._4_4_ = 0;
  ti = (double)args;
  args_local._0_4_ = nargs;
  std::operator<<((ostream *)&std::cout,"dare gli estremi dell\'intervallo: ");
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&tf);
  std::istream::operator>>(piVar2,&local_28);
  pcVar3 = *(char **)((long)ti + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar3,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::string(local_98,local_48);
  NomiFiles((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78,true,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (char *)local_48);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  MakeFolder(pcVar3);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78);
  local_d0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_d0);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&__range1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      std::__cxx11::string::~string(local_48);
      return args_local._4_4_;
    }
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_f0,(string *)pbVar4);
    std::operator+(local_358,(char *)local_48);
    std::operator+(local_338,local_358);
    std::operator+(local_318,(char *)local_338);
    std::ifstream::ifstream(local_2f8,local_318,8);
    std::__cxx11::string::~string((string *)local_318);
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::string::~string((string *)local_358);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,
                   (char *)&__range1);
    std::operator+(local_598,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t
                  );
    std::operator+(local_578,(char *)local_598);
    std::ofstream::ofstream(local_558,local_578,0x10);
    std::__cxx11::string::~string((string *)local_578);
    std::__cxx11::string::~string((string *)local_598);
    std::__cxx11::string::~string((string *)&t);
    std::__cxx11::string::string(local_5e0);
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_2f8,local_5e0);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) break;
      std::__cxx11::istringstream::istringstream(local_760,local_5e0,8);
      std::istream::operator>>((istream *)local_760,&local_5c0);
      if (tf <= local_5c0) {
        if (local_5c0 <= local_28) {
          this = std::operator<<(local_558,local_5e0);
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          local_764 = 0;
        }
        else {
          local_764 = 5;
        }
      }
      else {
        local_764 = 4;
      }
      std::__cxx11::istringstream::~istringstream(local_760);
    } while ((local_764 == 0) || (local_764 == 4));
    std::ifstream::close();
    std::ofstream::close();
    std::__cxx11::string::~string(local_5e0);
    std::ofstream::~ofstream(local_558);
    std::ifstream::~ifstream(local_2f8);
    std::__cxx11::string::~string(local_f0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

int main(int nargs, char** args) {
	double ti, tf;
	cout << "dare gli estremi dell'intervallo: "; 
	cin >> ti >> tf;

	string folderin(args[1]);
	auto nomi = NomiFiles(true, folderin);

	string folderout = folderin + "\\crop";
	MakeFolder(folderout.c_str());

	for(string f : nomi) {
		ifstream ifi(folderin + "\\" + f + ".txt");
		ofstream ofi(folderout + "\\" + f + "_crop.txt");
		double t;
		string riga;
		while(getline(ifi, riga)) {
			istringstream istr(riga); istr >> t;
			if(t < ti) continue;
			if(t > tf) break;
			ofi << riga << endl;
		};
		ifi.close();
		ofi.close();
	};
}